

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void * Timidity::safe_malloc(size_t count)

{
  void *pvVar1;
  char *error;
  
  if (count < "N11FRemapTable12UpdateNativeEv") {
    pvVar1 = malloc(count);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    error = "Timidity: Couldn\'t malloc %zu bytes.";
  }
  else {
    error = "Timidity: Tried allocating %zu bytes. This must be a bug.";
  }
  I_Error(error,count);
  return (void *)0x0;
}

Assistant:

void *safe_malloc(size_t count)
{
	void *p;
	if (count > (1 << 21))
	{
		I_Error("Timidity: Tried allocating %zu bytes. This must be a bug.", count);
	}
	else if ((p = malloc(count)))
	{
		return p;
	}
	else
	{
		I_Error("Timidity: Couldn't malloc %zu bytes.", count);
	}
	return 0;	// Unreachable.
}